

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

void __thiscall QMainWindow::insertToolBar(QMainWindow *this,QToolBar *before,QToolBar *toolbar)

{
  long lVar1;
  long in_FS_OFFSET;
  QObject local_40 [8];
  QObject local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QMainWindowLayout::removeToolBar(*(QMainWindowLayout **)(lVar1 + 0x260),toolbar);
  QToolBarPrivate::_q_updateIconSize
            (*(QToolBarPrivate **)&(toolbar->super_QWidget).field_0x8,(QSize *)(lVar1 + 0x268));
  QToolBarPrivate::_q_updateToolButtonStyle
            (*(QToolBarPrivate **)&(toolbar->super_QWidget).field_0x8,
             *(ToolButtonStyle *)(lVar1 + 0x274));
  QObject::connect(local_38,(char *)this,(QObject *)"2iconSizeChanged(QSize)",(char *)toolbar,
                   0x6e8274);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,(char *)this,(QObject *)"2toolButtonStyleChanged(Qt::ToolButtonStyle)",
                   (char *)toolbar,0x6e82bb);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QMainWindowLayout::insertToolBar(*(QMainWindowLayout **)(lVar1 + 0x260),before,toolbar);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindow::insertToolBar(QToolBar *before, QToolBar *toolbar)
{
    Q_D(QMainWindow);

    d->layout->removeToolBar(toolbar);

    toolbar->d_func()->_q_updateIconSize(d->iconSize);
    toolbar->d_func()->_q_updateToolButtonStyle(d->toolButtonStyle);
    connect(this, SIGNAL(iconSizeChanged(QSize)),
            toolbar, SLOT(_q_updateIconSize(QSize)));
    connect(this, SIGNAL(toolButtonStyleChanged(Qt::ToolButtonStyle)),
            toolbar, SLOT(_q_updateToolButtonStyle(Qt::ToolButtonStyle)));

    d->layout->insertToolBar(before, toolbar);
}